

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O2

string * fineftp::Filesystem::cleanPath
                   (string *__return_storage_ptr__,string *path,bool windows_path,
                   char output_separator)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  _List_node_base *p_Var4;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  string absolute_root;
  regex win_network_drive;
  stringstream path_ss;
  ostream local_1a8 [376];
  
  if (path->_M_string_length == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,".",(allocator *)&path_ss);
    return __return_storage_ptr__;
  }
  absolute_root._M_dataplus._M_p = (pointer)&absolute_root.field_2;
  absolute_root._M_string_length = 0;
  absolute_root.field_2._M_local_buf[0] = '\0';
  if (windows_path) {
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&path_ss,"^[a-zA-Z]\\:",0x10)
    ;
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&win_network_drive,"^[/\\\\]{2}[^/\\\\]+",0x10);
    bVar1 = ::std::
            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (path,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&path_ss,0);
    if (bVar1) {
      ::std::__cxx11::string::substr((ulong)&components,(ulong)path);
LAB_001202b0:
      ::std::__cxx11::string::operator=((string *)&absolute_root,(string *)&components);
      ::std::__cxx11::string::~string((string *)&components);
    }
    else {
      bVar1 = ::std::
              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (path,&win_network_drive,0);
      if (bVar1) {
        ::std::__cxx11::string::find_first_of((char *)path,0x12f7c6);
        ::std::__cxx11::string::substr((ulong)&components,(ulong)path);
        goto LAB_001202b0;
      }
    }
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (&win_network_drive);
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&path_ss);
  }
  else if (*(path->_M_dataplus)._M_p == '/') {
    ::std::__cxx11::string::operator=((string *)&absolute_root,'/');
  }
  components.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&components;
  components.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  components.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       components.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (absolute_root._M_string_length + 1 <= path->_M_string_length) {
    pcVar3 = "/";
    if (windows_path) {
      pcVar3 = "/\\";
    }
    do {
      lVar2 = ::std::__cxx11::string::find_first_of((char *)path,(ulong)pcVar3);
      _path_ss = local_1a8;
      local_1a8[0] = (ostream)0x0;
      if (lVar2 == -1) {
        ::std::__cxx11::string::substr((ulong)&win_network_drive,(ulong)path);
      }
      else {
        ::std::__cxx11::string::substr((ulong)&win_network_drive,(ulong)path);
      }
      ::std::__cxx11::string::operator=((string *)&path_ss,(string *)&win_network_drive);
      ::std::__cxx11::string::~string((string *)&win_network_drive);
      ::std::__cxx11::string::~string((string *)&path_ss);
    } while ((lVar2 != -1) && (lVar2 + 1U < path->_M_string_length));
    if (absolute_root._M_string_length == 0 &&
        components.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size == 0) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,".",(allocator *)&path_ss);
      goto LAB_00120539;
    }
  }
  ::std::__cxx11::stringstream::stringstream((stringstream *)&path_ss);
  ::std::operator<<(local_1a8,(string *)&absolute_root);
  p_Var4 = (_List_node_base *)&components;
  if ((windows_path) && (absolute_root._M_string_length != 0)) {
    ::std::operator<<(local_1a8,output_separator);
  }
  while (p_Var4 = (((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)p_Var4)->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&components) {
    if (p_Var4 != components.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
      ::std::operator<<(local_1a8,output_separator);
    }
    ::std::operator<<(local_1a8,(string *)(p_Var4 + 1));
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&path_ss);
LAB_00120539:
  ::std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&components.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  ::std::__cxx11::string::~string((string *)&absolute_root);
  return __return_storage_ptr__;
}

Assistant:

std::string cleanPath(const std::string& path, bool windows_path, const char output_separator)
  {
    if (path.empty())
    {
      return ".";
    }

    // Find the root for absolute paths

    std::string absolute_root;

    if (windows_path)
    {
      /* On Windows, a root folder can be:
       *    C:\
       *    //Host
       *    \\Host
       */

      std::regex win_local_drive("^[a-zA-Z]\\:");                // Local drive
      std::regex win_network_drive("^[/\\\\]{2}[^/\\\\]+");      // Network path starting with two slashes or backslashes followed by a hostname

      if (std::regex_search(path, win_local_drive))
      {
        // Windows local drive, consisting of drive-letter and colon
        absolute_root = path.substr(0, 2);
      }
      else if (std::regex_search(path, win_network_drive))
      {
        // Window network drive, consisting of \\ and hostname
        size_t sep_pos = path.find_first_of("/\\", 2);
        absolute_root = path.substr(0, sep_pos); // If no seperator was found, this will return the entire string
      }
    }
    else
    {
      // On Unix there is only one root and it is '/'
      if (path[0] == '/')
      {
        absolute_root = '/';
      }
    }

    // Split the path
    std::list<std::string> components;

    if (path.size() >= (absolute_root.size() + 1))
    {
      size_t start, end;
      
      if (absolute_root.empty())
        start = 0;
      else
        start = absolute_root.size();

      do
      {
        if (windows_path)
          end = path.find_first_of("/\\", start);
        else
          end = path.find_first_of("/", start);

        std::string this_component;
        if (end == std::string::npos)
          this_component = path.substr(start);
        else
          this_component = path.substr(start, end - start);
        
        // The components-stack that will increase and shrink depending on the folders and .. elements in the splitted path
        if (this_component.empty() || (this_component == "."))
        {
        }
        else if (this_component == "..")
        {
          if (!absolute_root.empty())
          {
            if (!components.empty())
            {
              // Move one folder up if we are not already at the root
              components.pop_back();
            }
          }
          else
          {
            if (!components.empty() && (components.back() != ".."))
            {
              // Move one folder up by removing it. We must not remove ".." elements that we were not able to resolve previously.
              components.pop_back();
            }
            else
            {
              components.push_back("..");
            }
          }
        }
        else
        {
          components.push_back(this_component);
        }

        if (end == std::string::npos)
          break;
        else
          start = end + 1;

      } while (start < path.size());

      // Join the components again
      if (components.size() == 0 && absolute_root.empty())
      {
          return ".";
      }
    }

    std::stringstream path_ss;
    path_ss << absolute_root;

    if (windows_path && !absolute_root.empty())
    {
      path_ss << output_separator; // The windows drive must be followed by a separator. When referencing a network drive.
    }

    auto comp_it = components.begin();
    while (comp_it != components.end())
    {
      if (comp_it != components.begin())
        path_ss << output_separator;
      
      path_ss << *comp_it;

      comp_it++;
    }

    return path_ss.str();
  }